

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::simple_collector<(pybind11::return_value_policy)1>::call
          (simple_collector<(pybind11::return_value_policy)1> *this,PyObject *ptr)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  undefined8 in_RDX;
  handle local_40 [3];
  PyObject *local_28;
  PyObject *result;
  PyObject *ptr_local;
  simple_collector<(pybind11::return_value_policy)1> *this_local;
  
  ptr_local = ptr;
  this_local = this;
  pPVar1 = handle::ptr((handle *)ptr);
  local_28 = (PyObject *)PyObject_CallObject(in_RDX,pPVar1);
  if (local_28 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(local_40,local_28);
  reinterpret_steal<pybind11::object>((pybind11 *)this,local_40[0]);
  return (object)(handle)this;
}

Assistant:

object call(PyObject *ptr) const {
        PyObject *result = PyObject_CallObject(ptr, m_args.ptr());
        if (!result) {
            throw error_already_set();
        }
        return reinterpret_steal<object>(result);
    }